

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

int nghttp2_buf_reserve(nghttp2_buf *buf,size_t new_cap,nghttp2_mem *mem)

{
  ulong uVar1;
  uint8_t *puVar2;
  size_t local_40;
  size_t cap;
  uint8_t *ptr;
  nghttp2_mem *mem_local;
  size_t new_cap_local;
  nghttp2_buf *buf_local;
  
  uVar1 = (long)buf->end - (long)buf->begin;
  if (uVar1 < new_cap) {
    local_40 = new_cap;
    if (new_cap <= uVar1 * 2) {
      local_40 = uVar1 * 2;
    }
    puVar2 = (uint8_t *)nghttp2_mem_realloc(mem,buf->begin,local_40);
    if (puVar2 == (uint8_t *)0x0) {
      buf_local._4_4_ = -0x385;
    }
    else {
      buf->pos = puVar2 + ((long)buf->pos - (long)buf->begin);
      buf->last = puVar2 + ((long)buf->last - (long)buf->begin);
      buf->mark = puVar2 + ((long)buf->mark - (long)buf->begin);
      buf->begin = puVar2;
      buf->end = puVar2 + local_40;
      buf_local._4_4_ = 0;
    }
  }
  else {
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

int nghttp2_buf_reserve(nghttp2_buf *buf, size_t new_cap, nghttp2_mem *mem) {
  uint8_t *ptr;
  size_t cap;

  cap = nghttp2_buf_cap(buf);

  if (cap >= new_cap) {
    return 0;
  }

  new_cap = nghttp2_max(new_cap, cap * 2);

  ptr = nghttp2_mem_realloc(mem, buf->begin, new_cap);
  if (ptr == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  buf->pos = ptr + (buf->pos - buf->begin);
  buf->last = ptr + (buf->last - buf->begin);
  buf->mark = ptr + (buf->mark - buf->begin);
  buf->begin = ptr;
  buf->end = ptr + new_cap;

  return 0;
}